

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

string * __thiscall
t_markdown_generator::make_file_link
          (string *__return_storage_ptr__,t_markdown_generator *this,string *filename)

{
  int iVar1;
  allocator local_21;
  string *local_20;
  string *filename_local;
  t_markdown_generator *this_local;
  
  local_20 = filename;
  filename_local = (string *)this;
  this_local = (t_markdown_generator *)__return_storage_ptr__;
  iVar1 = std::__cxx11::string::compare((string *)&this->current_file_);
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_markdown_generator::make_file_link(std::string filename) {
  return (current_file_.compare(filename) != 0) ? filename : "";
}